

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementScroll.cpp
# Opt level: O2

bool __thiscall Rml::ElementScroll::CreateScrollbar(ElementScroll *this,Orientation orientation)

{
  ElementPtr this_00;
  Type __p;
  Element *pEVar1;
  char *__s;
  Scrollbar *pSVar2;
  allocator<char> local_ba;
  allocator<char> local_b9;
  ElementPtr scrollbar_element;
  ElementPtr local_b0;
  Property local_a8;
  XMLAttributes local_58;
  String local_40;
  
  pSVar2 = this->scrollbars + orientation;
  if ((pSVar2->element == (Element *)0x0) ||
     ((WidgetScroll *)
      this->scrollbars[orientation].widget._M_t.
      super___uniq_ptr_impl<Rml::WidgetScroll,_std::default_delete<Rml::WidgetScroll>_>._M_t.
      super__Tuple_impl<0UL,_Rml::WidgetScroll_*,_std::default_delete<Rml::WidgetScroll>_>.
      super__Head_base<0UL,_Rml::WidgetScroll_*,_false> == (WidgetScroll *)0x0)) {
    pEVar1 = this->element;
    ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"*",&local_b9);
    __s = "scrollbarhorizontal";
    if (orientation == VERTICAL) {
      __s = "scrollbarvertical";
    }
    ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,__s,&local_ba);
    local_58.m_container.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.m_container.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.m_container.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    Factory::InstanceElement
              ((Factory *)&scrollbar_element,pEVar1,(String *)&local_a8,&local_40,&local_58);
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
    ::~vector(&local_58.m_container);
    ::std::__cxx11::string::~string((string *)&local_40);
    ::std::__cxx11::string::~string((string *)&local_a8);
    this_00 = scrollbar_element;
    pSVar2->element =
         (Element *)
         scrollbar_element._M_t.super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>.
         _M_t.super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
         super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl;
    Property::Property<int>(&local_a8,1,NUMBER,-1);
    Element::SetProperty
              ((Element *)
               this_00._M_t.super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
               super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
               super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl,Clip,&local_a8);
    Property::~Property(&local_a8);
    pEVar1 = pSVar2->element;
    Property::Property<Rml::Style::Drag,Rml::Style::Drag>(&local_a8,Block);
    Element::SetProperty(pEVar1,Drag,&local_a8);
    Property::~Property(&local_a8);
    ::std::make_unique<Rml::WidgetScroll,Rml::Element*&>((Element **)&local_a8);
    __p = local_a8.value.type;
    local_a8.value.type = 0;
    ::std::__uniq_ptr_impl<Rml::WidgetScroll,_std::default_delete<Rml::WidgetScroll>_>::reset
              ((__uniq_ptr_impl<Rml::WidgetScroll,_std::default_delete<Rml::WidgetScroll>_> *)
               &this->scrollbars[orientation].widget,(pointer)__p);
    ::std::unique_ptr<Rml::WidgetScroll,_std::default_delete<Rml::WidgetScroll>_>::~unique_ptr
              ((unique_ptr<Rml::WidgetScroll,_std::default_delete<Rml::WidgetScroll>_> *)&local_a8);
    WidgetScroll::Initialise
              ((WidgetScroll *)
               this->scrollbars[orientation].widget._M_t.
               super___uniq_ptr_impl<Rml::WidgetScroll,_std::default_delete<Rml::WidgetScroll>_>.
               _M_t.
               super__Tuple_impl<0UL,_Rml::WidgetScroll_*,_std::default_delete<Rml::WidgetScroll>_>.
               super__Head_base<0UL,_Rml::WidgetScroll_*,_false>,
               HORIZONTAL - (orientation == VERTICAL));
    local_b0 = (ElementPtr)
               (ElementPtr)
               scrollbar_element._M_t.
               super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
               super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
               super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl;
    scrollbar_element._M_t.super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
    super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
    super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl =
         (__uniq_ptr_data<Rml::Element,_Rml::Releaser<Rml::Element>,_true,_true>)
         (__uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>)0x0;
    pEVar1 = Element::AppendChild(this->element,&local_b0,false);
    ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::~unique_ptr(&local_b0);
    UpdateScrollElementProperties(this,pEVar1);
    ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::~unique_ptr(&scrollbar_element);
  }
  return true;
}

Assistant:

bool ElementScroll::CreateScrollbar(Orientation orientation)
{
	if (scrollbars[orientation].element && scrollbars[orientation].widget)
		return true;

	ElementPtr scrollbar_element =
		Factory::InstanceElement(element, "*", orientation == VERTICAL ? "scrollbarvertical" : "scrollbarhorizontal", XMLAttributes());
	scrollbars[orientation].element = scrollbar_element.get();
	scrollbars[orientation].element->SetProperty(PropertyId::Clip, Property(1, Unit::NUMBER));
	scrollbars[orientation].element->SetProperty(PropertyId::Drag, Property(Style::Drag::Block));

	scrollbars[orientation].widget = MakeUnique<WidgetScroll>(scrollbars[orientation].element);
	scrollbars[orientation].widget->Initialise(orientation == VERTICAL ? WidgetScroll::VERTICAL : WidgetScroll::HORIZONTAL);

	Element* child = element->AppendChild(std::move(scrollbar_element), false);

	UpdateScrollElementProperties(child);

	return true;
}